

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNStmProg::fold_constants(CTPNStmProg *this,CTcPrsSymtab *symtab)

{
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTPNStmTop *cur;
  CTPNStmTop *local_18;
  
  for (local_18 = (CTPNStmTop *)in_RDI[4].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      local_18 != (CTPNStmTop *)0x0; local_18 = CTPNStmTop::get_next_stm_top(local_18)) {
    (*(local_18->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[0xf])(local_18,in_RSI);
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNStmProg::fold_constants(class CTcPrsSymtab *symtab)
{
    CTPNStmTop *cur;

    /* iterate through our statements and fold constants in each one */
    for (cur = first_stm_ ; cur != 0 ; cur = cur->get_next_stm_top())
        cur->fold_constants(symtab);

    /* 
     *   although nodes within our subtree might have been changed, this
     *   compound statement itself is unchanged by constant folding 
     */
    return this;
}